

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O2

uchar * stbtt_GetGlyphBitmapSubpixel
                  (stbtt_fontinfo *info,float scale_x,float scale_y,float shift_x,float shift_y,
                  int glyph,int *width,int *height,int *xoff,int *yoff)

{
  uchar *puVar1;
  int iVar2;
  float scale_x_00;
  float scale_y_00;
  void *in_stack_ffffffffffffff58;
  stbtt__bitmap local_98;
  int local_80;
  int local_7c;
  int ix0;
  int iy0;
  int ix1;
  int iy1;
  int *local_68;
  int *local_60;
  int *local_58;
  int local_4c;
  stbtt_vertex *local_48;
  stbtt_vertex *vertices;
  float local_38;
  float local_34;
  
  _ix1 = width;
  vertices._0_4_ = shift_y;
  vertices._4_4_ = shift_x;
  local_38 = scale_x;
  local_34 = scale_y;
  local_4c = stbtt_GetGlyphShape(info,glyph,&local_48);
  scale_x_00 = local_38;
  if ((local_38 == 0.0) && (!NAN(local_38))) {
    scale_x_00 = local_34;
  }
  scale_y_00 = local_34;
  if ((local_34 == 0.0) && (!NAN(local_34))) {
    scale_y_00 = scale_x_00;
  }
  if (local_38 == 0.0 && local_34 == 0.0) {
    free(local_48);
    puVar1 = (uchar *)0x0;
  }
  else {
    local_68 = yoff;
    local_60 = xoff;
    local_58 = height;
    local_38 = scale_x_00;
    local_34 = scale_y_00;
    stbtt_GetGlyphBitmapBoxSubpixel
              (info,glyph,scale_x_00,scale_y_00,vertices._4_4_,vertices._0_4_,&local_80,&local_7c,
               &ix0,&iy0);
    iVar2 = ix0 - local_80;
    local_98.h = iy0 - local_7c;
    if (_ix1 != (int *)0x0) {
      *_ix1 = iVar2;
    }
    if (local_58 != (int *)0x0) {
      *local_58 = local_98.h;
    }
    if (local_60 != (int *)0x0) {
      *local_60 = local_80;
    }
    if (local_68 != (int *)0x0) {
      *local_68 = local_7c;
    }
    local_98.w = iVar2;
    if ((ix0 == local_80 || iy0 == local_7c) ||
       (puVar1 = (uchar *)malloc((long)(local_98.h * iVar2)), local_98.pixels = puVar1,
       puVar1 == (uchar *)0x0)) {
      puVar1 = (uchar *)0x0;
    }
    else {
      local_98.stride = iVar2;
      stbtt_Rasterize(&local_98,0.35,local_48,local_4c,local_38,local_34,vertices._4_4_,
                      vertices._0_4_,local_80,local_7c,1,in_stack_ffffffffffffff58);
    }
    free(local_48);
  }
  return puVar1;
}

Assistant:

STBTT_DEF unsigned char *stbtt_GetGlyphBitmapSubpixel(const stbtt_fontinfo *info, float scale_x, float scale_y, float shift_x, float shift_y, int glyph, int *width, int *height, int *xoff, int *yoff)
{
   int ix0,iy0,ix1,iy1;
   stbtt__bitmap gbm;
   stbtt_vertex *vertices;   
   int num_verts = stbtt_GetGlyphShape(info, glyph, &vertices);

   if (scale_x == 0) scale_x = scale_y;
   if (scale_y == 0) {
      if (scale_x == 0) {
         STBTT_free(vertices, info->userdata);
         return NULL;
      }
      scale_y = scale_x;
   }

   stbtt_GetGlyphBitmapBoxSubpixel(info, glyph, scale_x, scale_y, shift_x, shift_y, &ix0,&iy0,&ix1,&iy1);

   // now we get the size
   gbm.w = (ix1 - ix0);
   gbm.h = (iy1 - iy0);
   gbm.pixels = NULL; // in case we error

   if (width ) *width  = gbm.w;
   if (height) *height = gbm.h;
   if (xoff  ) *xoff   = ix0;
   if (yoff  ) *yoff   = iy0;
   
   if (gbm.w && gbm.h) {
      gbm.pixels = (unsigned char *) STBTT_malloc(gbm.w * gbm.h, info->userdata);
      if (gbm.pixels) {
         gbm.stride = gbm.w;

         stbtt_Rasterize(&gbm, 0.35f, vertices, num_verts, scale_x, scale_y, shift_x, shift_y, ix0, iy0, 1, info->userdata);
      }
   }
   STBTT_free(vertices, info->userdata);
   return gbm.pixels;
}